

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O2

void ToHessenbergForm(Matrix *m)

{
  int start;
  int end;
  int iVar1;
  int iVar2;
  double *now;
  long lVar3;
  pointer pdVar4;
  double *pdVar5;
  int iVar6;
  int i;
  long lVar7;
  long lVar8;
  int column;
  int iVar9;
  double dVar10;
  allocator_type local_b1;
  double local_b0;
  int local_a8;
  int local_a4;
  double local_a0;
  Vector w;
  _Vector_base<double,_std::allocator<double>_> local_68;
  value_type local_50;
  Vector r;
  
  end = Matrix::GetCols(m);
  iVar1 = 0;
  if (0 < end) {
    iVar1 = end;
  }
  iVar2 = 2;
  if (2 < end) {
    iVar2 = end;
  }
  local_a8 = 1;
  iVar9 = 0;
  local_a4 = end;
  while( true ) {
    iVar6 = iVar9;
    if (iVar9 < local_a4) {
      iVar6 = local_a4;
    }
    if (iVar9 == iVar2 + -2) break;
    start = iVar9 + 1;
    Matrix::GetColPart((Vector *)&local_68,m,iVar9,start,end);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &r.super__Vector_base<double,_std::allocator<double>_>,
               (long)(int)((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_68._M_impl.super__Vector_impl_data._M_start) >> 3),
               &local_50,&local_b1);
    local_b0 = *local_68._M_impl.super__Vector_impl_data._M_start;
    dVar10 = Utils::EuclideanNorm((Vector *)&local_68);
    *r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = dVar10 * (double)(int)((uint)(local_b0 < 0.0) - (uint)(0.0 < local_b0));
    Utils::SubVectors(&w,(Vector *)&local_68,
                      (Vector *)&r.super__Vector_base<double,_std::allocator<double>_>);
    dVar10 = Utils::EuclideanNorm(&w);
    lVar3 = (long)local_a8;
    for (pdVar4 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 != w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
      *pdVar4 = *pdVar4 / dVar10;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&r.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
    lVar8 = (long)(local_a4 -
                  (int)((ulong)((long)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3));
    for (; iVar9 != iVar6; iVar9 = iVar9 + 1) {
      Matrix::GetColPart((Vector *)&r.super__Vector_base<double,_std::allocator<double>_>,m,iVar9,
                         start,end);
      local_a0 = Utils::ScalarMultiply
                           (&w,(Vector *)&r.super__Vector_base<double,_std::allocator<double>_>);
      local_a0 = local_a0 * -2.0;
      for (lVar7 = lVar3; lVar7 < end; lVar7 = lVar7 + 1) {
        local_b0 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7 - lVar8];
        pdVar5 = Matrix::operator()(m,(int)lVar7,iVar9);
        *pdVar5 = local_b0 * local_a0 + *pdVar5;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&r.super__Vector_base<double,_std::allocator<double>_>);
    }
    for (iVar9 = 0; iVar9 != iVar1; iVar9 = iVar9 + 1) {
      Matrix::GetRowPart((Vector *)&r.super__Vector_base<double,_std::allocator<double>_>,m,iVar9,
                         start,end);
      local_a0 = Utils::ScalarMultiply
                           ((Vector *)&w.super__Vector_base<double,_std::allocator<double>_>,
                            (Vector *)&r.super__Vector_base<double,_std::allocator<double>_>);
      local_a0 = local_a0 * -2.0;
      for (lVar7 = lVar3; lVar7 < end; lVar7 = lVar7 + 1) {
        local_b0 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7 - lVar8];
        pdVar5 = Matrix::operator()(m,iVar9,(int)lVar7);
        *pdVar5 = local_b0 * local_a0 + *pdVar5;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&r.super__Vector_base<double,_std::allocator<double>_>);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&w.super__Vector_base<double,_std::allocator<double>_>);
    local_a8 = local_a8 + 1;
    iVar9 = start;
  }
  return;
}

Assistant:

void ToHessenbergForm(Matrix &m)
{
    int n = m.GetCols();

    for (int j = 0; j < n - 2; ++j)
    {
        Vector w = GetW(m.GetColPart(j, j + 1, n));
        int offset = n - w.size();

        // Transforming columns
        for (int column = j; column < n; ++column)
        {
            Vector colPart = m.GetColPart(column, j + 1, n);
            double dot = Utils::ScalarMultiply(w, colPart);
            for (int i = j + 1; i < n; ++i)
            {
                m(i, column) -= 2 * dot * w[i - offset];
            }
        }

        // Transforming rows
        for (int row = 0; row < n; ++row)
        {
            Vector rowPart = m.GetRowPart(row, j + 1, n);
            double dot = Utils::ScalarMultiply(w, rowPart);
            for (int i = j + 1; i < n; ++i)
            {
                m(row, i) -= 2 * dot * w[i - offset];
            }
        }
    }
}